

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorShowLabel::dropEvent(QColorShowLabel *this,QDropEvent *e)

{
  PrivateShared *pPVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  ushort uVar5;
  bool bVar6;
  ulong uVar7;
  QMetaType QVar8;
  anon_union_24_3_e3d07ef4_for_data *paVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  undefined4 uVar11;
  QMetaType local_70;
  QMetaType local_68;
  int iStack_60;
  ushort uStack_5c;
  undefined2 uStack_5a;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar9 = &local_58;
  QMimeData::colorData();
  local_70.d_ptr = &QMetaTypeInterfaceWrapper<QColor>::metaType;
  uVar7 = CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc;
  local_68.d_ptr._0_4_ = (undefined4)uVar7;
  local_68.d_ptr._4_2_ = (undefined2)(uVar7 >> 0x20);
  local_68.d_ptr._6_2_ = (undefined2)(uVar7 >> 0x30);
  bVar6 = comparesEqual(&local_68,&local_70);
  if (bVar6) {
    if ((local_40 & 1) == 0) {
      local_68.d_ptr._0_4_ = local_58._0_4_;
      uVar10 = local_58._4_4_;
      iStack_60 = local_58._8_4_;
      uVar11 = local_58._12_4_;
    }
    else {
      pPVar1 = local_58.shared + *(int *)(local_58.shared + 4);
      local_68.d_ptr._0_4_ = *(undefined4 *)pPVar1;
      uVar10 = *(undefined4 *)(pPVar1 + 4);
      iStack_60 = *(int *)(pPVar1 + 8);
      uVar11 = *(undefined4 *)(pPVar1 + 0xc);
    }
    local_68.d_ptr._4_2_ = (undefined2)uVar10;
    local_68.d_ptr._6_2_ = (undefined2)((uint)uVar10 >> 0x10);
    uStack_5c = (ushort)uVar11;
    uStack_5a = (undefined2)((uint)uVar11 >> 0x10);
  }
  else {
    uStack_5a = 0xaaaa;
    local_68.d_ptr._0_4_ = 0;
    local_68.d_ptr._4_2_ = 0xffff;
    local_68.d_ptr._6_2_ = 0;
    iStack_60 = 0;
    uStack_5c = 0;
    QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_40 & 1) != 0) {
      paVar9 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_58.shared + *(int *)(local_58.shared + 4));
    }
    QMetaType::convert(QVar8,paVar9,local_70,&local_68);
  }
  uVar5 = uStack_5c;
  iVar4 = iStack_60;
  iVar3 = local_68.d_ptr._0_4_;
  uVar2 = CONCAT26(local_68.d_ptr._6_2_,CONCAT24(local_68.d_ptr._4_2_,local_68.d_ptr._0_4_));
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (iVar3 != 0) {
    *(undefined8 *)&this->col = uVar2;
    *(int *)((long)&(this->col).ct + 4) = iVar4;
    (this->col).ct.argb.pad = uVar5;
    QWidget::repaint((QWidget *)this);
    local_68.d_ptr._0_4_ = QColor::rgb();
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = &local_68;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_58.shared);
  }
  e[0xc] = (QDropEvent)(iVar3 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorShowLabel::dropEvent(QDropEvent *e)
{
    QColor color = qvariant_cast<QColor>(e->mimeData()->colorData());
    if (color.isValid()) {
        col = color;
        repaint();
        emit colorDropped(col.rgb());
        e->accept();
    } else {
        e->ignore();
    }
}